

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_create_art_index.cpp
# Opt level: O1

SinkResultType __thiscall
duckdb::PhysicalCreateARTIndex::SinkSorted(PhysicalCreateARTIndex *this,OperatorSinkInput *input)

{
  LocalSinkState *this_00;
  LocalSinkState *pLVar1;
  TableIOManager *args_3;
  AttachedDatabase *args_5;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  pointer pCVar5;
  pointer pBVar6;
  pointer pBVar7;
  pointer pBVar8;
  pointer this_01;
  type other_index;
  ConstraintException *pCVar9;
  templated_unique_single_t art;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  pLVar1 = input->local_state;
  iVar3 = (*(this->table->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
            super_CatalogEntry._vptr_CatalogEntry[0x10])();
  this_00 = pLVar1 + 1;
  pCVar5 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
           operator->(&this->info);
  local_38 = &pCVar5->index_name;
  pBVar6 = unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::operator->
                     ((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>
                       *)this_00);
  iVar4 = (*(pBVar6->super_Index)._vptr_Index[5])(pBVar6);
  local_58._M_dataplus._M_p._0_1_ = (char)iVar4;
  pBVar6 = unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::operator->
                     ((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>
                       *)this_00);
  pBVar7 = unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::operator->
                     ((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>
                       *)this_00);
  args_3 = (pBVar7->super_Index).table_io_manager;
  pBVar7 = unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::operator->
                     ((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>
                       *)this_00);
  args_5 = *(AttachedDatabase **)(CONCAT44(extraout_var,iVar3) + 0x10);
  pBVar8 = unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::operator->
                     ((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>
                       *)this_00);
  make_uniq<duckdb::ART,std::__cxx11::string&,duckdb::IndexConstraintType,duckdb::vector<unsigned_long,true>const&,duckdb::TableIOManager&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&,duckdb::AttachedDatabase&,duckdb::shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,std::default_delete<duckdb::FixedSizeAllocator>,false>,9ul>,true>&>
            ((duckdb *)&art,local_38,(IndexConstraintType *)&local_58,
             &(pBVar6->super_Index).column_ids,args_3,&pBVar7->unbound_expressions,args_5,
             (shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
              *)&pBVar8[1].super_Index.column_ids);
  this_01 = unique_ptr<duckdb::ART,_std::default_delete<duckdb::ART>,_true>::operator->(&art);
  bVar2 = ART::Construct(this_01,(unsafe_vector<ARTKey> *)(pLVar1 + 4),
                         (unsafe_vector<ARTKey> *)&pLVar1[6].partition_info.min_batch_index,
                         pLVar1[3].partition_info.batch_index.index);
  if (!bVar2) {
    pCVar9 = (ConstraintException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Data contains duplicates on indexed column(s)","");
    ConstraintException::ConstraintException(pCVar9,&local_58);
    __cxa_throw(pCVar9,&ConstraintException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pBVar6 = unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::operator->
                     ((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>
                       *)this_00);
  other_index = unique_ptr<duckdb::ART,_std::default_delete<duckdb::ART>,_true>::operator*(&art);
  bVar2 = BoundIndex::MergeIndexes(pBVar6,&other_index->super_BoundIndex);
  if (bVar2) {
    if (art.super_unique_ptr<duckdb::ART,_std::default_delete<duckdb::ART>_>._M_t.
        super___uniq_ptr_impl<duckdb::ART,_std::default_delete<duckdb::ART>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::ART_*,_std::default_delete<duckdb::ART>_>.
        super__Head_base<0UL,_duckdb::ART_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::ART,_std::default_delete<duckdb::ART>,_true,_true>)0x0) {
      (**(code **)(*(long *)art.super_unique_ptr<duckdb::ART,_std::default_delete<duckdb::ART>_>.
                            _M_t.
                            super___uniq_ptr_impl<duckdb::ART,_std::default_delete<duckdb::ART>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_duckdb::ART_*,_std::default_delete<duckdb::ART>_>
                            .super__Head_base<0UL,_duckdb::ART_*,_false>._M_head_impl + 8))();
    }
    return NEED_MORE_INPUT;
  }
  pCVar9 = (ConstraintException *)__cxa_allocate_exception(0x10);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Data contains duplicates on indexed column(s)","");
  ConstraintException::ConstraintException(pCVar9,&local_58);
  __cxa_throw(pCVar9,&ConstraintException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

SinkResultType PhysicalCreateARTIndex::SinkSorted(OperatorSinkInput &input) const {

	auto &l_state = input.local_state.Cast<CreateARTIndexLocalSinkState>();
	auto &storage = table.GetStorage();
	auto &l_index = l_state.local_index;

	// Construct an ART for this chunk.
	auto art = make_uniq<ART>(info->index_name, l_index->GetConstraintType(), l_index->GetColumnIds(),
	                          l_index->table_io_manager, l_index->unbound_expressions, storage.db,
	                          l_index->Cast<ART>().allocators);
	if (!art->Construct(l_state.keys, l_state.row_ids, l_state.key_chunk.size())) {
		throw ConstraintException("Data contains duplicates on indexed column(s)");
	}

	// Merge the ART into the local ART.
	if (!l_index->MergeIndexes(*art)) {
		throw ConstraintException("Data contains duplicates on indexed column(s)");
	}

	return SinkResultType::NEED_MORE_INPUT;
}